

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

Point * __thiscall tiger::trains::world::World::getPointOfPost(World *this,IPost *post)

{
  const_iterator cVar1;
  int local_c;
  
  local_c = (*post->_vptr_IPost[4])(post);
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Point_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
          ::find(&(this->pointOfPost)._M_t,&local_c);
  return (Point *)cVar1._M_node[1]._M_parent;
}

Assistant:

Point *World::getPointOfPost(const IPost *post) const
{
    return pointOfPost.find(post->getIdx())->second;
}